

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  double dVar4;
  bool bVar5;
  undefined1 uVar6;
  bool bVar7;
  xpath_value_type xVar8;
  int *piVar9;
  xml_attribute xVar10;
  long lVar11;
  char *pcVar12;
  xpath_memory_block *pxVar13;
  xpath_ast_node *pxVar14;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar15;
  byte bVar16;
  char_t *src;
  byte bVar17;
  less_equal *in_R8;
  int *dst;
  undefined1 local_fc;
  double v;
  xpath_memory_block *local_e8;
  size_t sStack_e0;
  bool *local_d8;
  double local_d0;
  xpath_node_set_raw local_c8;
  xpath_node_set_raw local_a8;
  double local_88;
  xpath_allocator_capture local_80;
  xpath_string local_60;
  xpath_string local_48;
  
  local_fc = xpath_type_none;
LAB_002b3c98:
  cVar1 = this->_type;
  lVar11 = 0x10;
  switch(cVar1) {
  case '\x01':
    bVar5 = eval_boolean(this->_left,c,stack);
    if (bVar5) {
switchD_002b3ce3_caseD_2f:
      uVar6 = xpath_type_node_set;
      goto LAB_002b42f1;
    }
    break;
  case '\x02':
    bVar5 = eval_boolean(this->_left,c,stack);
    if (!bVar5) goto switchD_002b3ce3_caseD_30;
    break;
  case '\x03':
    goto switchD_002b3cac_caseD_3;
  case '\x04':
    pxVar14 = this->_left;
    this = this->_right;
    cVar1 = pxVar14->_rettype;
    cVar2 = this->_rettype;
    if ((cVar1 == '\x01') || (cVar2 == '\x01')) {
      if (cVar2 == '\x01' && cVar1 == '\x01') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_node_set(&local_a8,pxVar14,c,stack,nodeset_eval_all);
        eval_node_set(&local_c8,this,c,stack,nodeset_eval_all);
        for (; uVar6 = local_a8._begin != local_a8._end,
            pxVar13 = (xpath_memory_block *)local_c8._begin, (bool)uVar6;
            local_a8._begin = local_a8._begin + 1) {
          while (pxVar13 != (xpath_memory_block *)local_c8._end) {
            local_80._target = stack->result;
            local_80._state._error = (local_80._target)->_error;
            local_80._state._root = (local_80._target)->_root;
            local_80._state._root_size = (local_80._target)->_root_size;
            string_value(&local_60,local_a8._begin,local_80._target);
            string_value(&local_48,(xpath_node *)pxVar13,stack->result);
            bVar5 = strequal(local_60._buffer,local_48._buffer);
            xpath_allocator_capture::~xpath_allocator_capture(&local_80);
            pxVar13 = (xpath_memory_block *)&pxVar13->field_2;
            if (!bVar5) goto LAB_002b40ab;
          }
        }
        goto LAB_002b40ab;
      }
      pxVar15 = pxVar14;
      if (cVar1 == '\x01') {
        pxVar15 = this;
        cVar1 = cVar2;
        this = pxVar14;
      }
      if (cVar1 == '\x02') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        local_88 = eval_number(pxVar15,c,stack);
        eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
        goto LAB_002b48f6;
      }
      if (cVar1 == '\x03') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_80,pxVar15,c,stack);
        eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
        goto LAB_002b482a;
      }
      if (cVar1 != '\x04') goto LAB_002b49c3;
      bVar5 = eval_boolean(pxVar15,c,stack);
      bVar7 = eval_boolean(this,c,stack);
      local_fc = local_fc ^ bVar7 != bVar5;
      goto LAB_002b42f4;
    }
    if (cVar1 == '\x04' || cVar2 == '\x04') goto code_r0x002b3d40;
    if (cVar1 == '\x02' || cVar2 == '\x02') {
      local_d0 = eval_number(pxVar14,c,stack);
      dVar4 = eval_number(this,c,stack);
      uVar6 = dVar4 != local_d0;
      goto LAB_002b42f1;
    }
    if (cVar1 == '\x03' || cVar2 == '\x03') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_a8,pxVar14,c,stack);
      eval_string((xpath_string *)&local_c8,this,c,stack);
      bVar5 = strequal((char_t *)local_a8._0_8_,(char_t *)local_c8._0_8_);
      uVar6 = !bVar5;
      goto LAB_002b40ab;
    }
LAB_002b49c3:
    pcVar12 = 
    "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::not_equal_to]"
    ;
    goto LAB_002b49b9;
  case '\x05':
    pxVar15 = this->_left;
    pxVar14 = this->_right;
    goto LAB_002b3eaa;
  case '\x06':
    pxVar14 = this->_left;
    pxVar15 = this->_right;
LAB_002b3eaa:
    uVar6 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                      (pxVar15,pxVar14,c,stack,(less *)in_R8);
    goto LAB_002b42f1;
  case '\a':
    pxVar15 = this->_left;
    pxVar14 = this->_right;
    goto LAB_002b3e91;
  case '\b':
    pxVar14 = this->_left;
    pxVar15 = this->_right;
LAB_002b3e91:
    uVar6 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                      (pxVar15,pxVar14,c,stack,in_R8);
    goto LAB_002b42f1;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
switchD_002b3cac_caseD_9:
    xVar8 = (xpath_value_type)(byte)this->_rettype;
    goto LAB_002b3e32;
  case '\x14':
    xVar8 = (xpath_value_type)this->_rettype;
    if (((this->_data).variable)->_type != xVar8) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2969,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x04') {
      uVar6 = (undefined1)(this->_data).variable[1]._type;
      goto LAB_002b42f1;
    }
LAB_002b3e32:
    if ((char)xVar8 == '\x01') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_node_set(&local_a8,this,c,stack,nodeset_eval_any);
      bVar5 = local_a8._begin == local_a8._end;
    }
    else {
      if ((xVar8 & 0xff) != xpath_type_string) {
        if ((xVar8 & 0xff) != xpath_type_number) {
          __assert_fail("false && \"Wrong expression for return type boolean\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x298b,
                        "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                       );
        }
        dVar4 = eval_number(this,c,stack);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          uVar6 = xpath_type_node_set;
          goto LAB_002b42f1;
        }
        goto switchD_002b3ce3_caseD_30;
      }
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_a8,this,c,stack);
      bVar5 = *(char *)local_a8._0_8_ == '\0';
    }
LAB_002b40a4:
    uVar6 = !bVar5;
    goto LAB_002b40ab;
  default:
    lVar11 = 8;
    switch(cVar1) {
    case '\"':
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_a8,this->_left,c,stack);
      eval_string((xpath_string *)&local_c8,this->_right,c,stack);
      uVar6 = starts_with((char_t *)local_a8._0_8_,(char_t *)local_c8._0_8_);
      goto LAB_002b40ab;
    case '#':
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_a8,this->_left,c,stack);
      eval_string((xpath_string *)&local_c8,this->_right,c,stack);
      pcVar12 = strstr((char *)local_a8._0_8_,(char *)local_c8._0_8_);
      bVar5 = pcVar12 == (char *)0x0;
      goto LAB_002b40a4;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_002b3cac_caseD_9;
    case '-':
      goto switchD_002b3ce3_caseD_2d;
    case '.':
      bVar5 = eval_boolean(this->_left,c,stack);
      goto LAB_002b4265;
    case '/':
      goto switchD_002b3ce3_caseD_2f;
    case '0':
      break;
    case '1':
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_a8,this->_left,c,stack);
        local_c8._0_8_ = xpath_node::node(&c->n);
        goto LAB_002b3f10;
      }
      break;
    default:
      if (cVar1 != ';') goto switchD_002b3cac_caseD_9;
      dst = (int *)(this->_right->_data).string;
      if (this->_right->_type != '\x12') {
        if (*dst == 3) {
          piVar9 = *(int **)(dst + 4);
        }
        else {
          piVar9 = (int *)0x0;
        }
        dst = (int *)0x3224cd;
        if (piVar9 != (int *)0x0) {
          dst = piVar9;
        }
      }
      v = (double)xpath_node::node(&c->n);
      xVar10 = xml_node::attribute((xml_node *)&v,(this->_left->_data).string);
      if (xVar10._attr != (xml_attribute_struct *)0x0) {
        src = (xVar10._attr)->value;
        if (src == (char_t *)0x0) {
          src = "";
        }
        bVar5 = strequal(src,(char_t *)dst);
        if (bVar5) {
          pcVar12 = "";
          if ((xVar10._attr)->name != (char_t *)0x0) {
            pcVar12 = (xVar10._attr)->name;
          }
          uVar6 = is_xpath_attribute(pcVar12);
          goto LAB_002b42f1;
        }
      }
    }
switchD_002b3ce3_caseD_30:
    uVar6 = xpath_type_none;
    goto LAB_002b42f1;
  }
switchD_002b3ce3_caseD_2d:
  this = *(xpath_ast_node **)(&this->_type + lVar11);
  goto LAB_002b3c98;
LAB_002b3f10:
  if ((xml_node_struct *)local_c8._0_8_ == (xml_node_struct *)0x0) goto LAB_002b4272;
  xVar10 = xml_node::attribute((xml_node *)&local_c8,"xml:lang");
  if (xVar10._attr != (xml_attribute_struct *)0x0) {
    pcVar12 = "";
    if ((xVar10._attr)->value != (char *)0x0) {
      pcVar12 = (xVar10._attr)->value;
    }
    lVar11 = 0;
    goto LAB_002b4328;
  }
  local_c8._0_8_ = xml_node::parent((xml_node *)&local_c8);
  goto LAB_002b3f10;
LAB_002b4272:
  uVar6 = false;
  goto LAB_002b43f5;
LAB_002b4328:
  bVar3 = *(byte *)(local_a8._0_8_ + lVar11);
  if (bVar3 == 0) goto LAB_002b43df;
  bVar16 = bVar3 | 0x20;
  if (0x19 < (int)(char)bVar3 - 0x41U) {
    bVar16 = bVar3;
  }
  bVar3 = pcVar12[lVar11];
  bVar17 = bVar3 | 0x20;
  if (0x19 < (int)(char)bVar3 - 0x41U) {
    bVar17 = bVar3;
  }
  if (bVar16 != bVar17) {
    uVar6 = false;
    goto LAB_002b43f5;
  }
  lVar11 = lVar11 + 1;
  goto LAB_002b4328;
LAB_002b43df:
  uVar6 = pcVar12[lVar11] == '-' || pcVar12[lVar11] == '\0';
LAB_002b43f5:
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&v);
  goto LAB_002b42f1;
LAB_002b48f6:
  uVar6 = local_a8._begin != local_a8._end;
  if (local_a8._begin == local_a8._end) goto LAB_002b40ab;
  local_c8._0_8_ = stack->result;
  local_c8._eos = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_error;
  local_c8._begin = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root;
  local_c8._end = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root_size;
  string_value((xpath_string *)&local_80,local_a8._begin,(xpath_allocator *)local_c8._0_8_);
  local_d0 = convert_string_to_number((char_t *)local_80._target);
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_c8);
  local_a8._begin = local_a8._begin + 1;
  if ((local_88 != local_d0) || (NAN(local_88) || NAN(local_d0))) goto LAB_002b40ab;
  goto LAB_002b48f6;
code_r0x002b3d40:
  bVar5 = eval_boolean(pxVar14,c,stack);
  local_fc = local_fc ^ bVar5;
  goto LAB_002b3c98;
switchD_002b3cac_caseD_3:
  pxVar14 = this->_left;
  pxVar15 = this->_right;
  cVar1 = pxVar14->_rettype;
  cVar2 = pxVar15->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_node_set(&local_a8,pxVar14,c,stack,nodeset_eval_all);
      eval_node_set(&local_c8,pxVar15,c,stack,nodeset_eval_all);
      for (; uVar6 = local_a8._begin != local_a8._end,
          pxVar13 = (xpath_memory_block *)local_c8._begin, (bool)uVar6;
          local_a8._begin = local_a8._begin + 1) {
        while (pxVar13 != (xpath_memory_block *)local_c8._end) {
          local_80._target = stack->result;
          local_80._state._error = (local_80._target)->_error;
          local_80._state._root = (local_80._target)->_root;
          local_80._state._root_size = (local_80._target)->_root_size;
          string_value(&local_60,local_a8._begin,local_80._target);
          string_value(&local_48,(xpath_node *)pxVar13,stack->result);
          bVar5 = strequal(local_60._buffer,local_48._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_80);
          pxVar13 = (xpath_memory_block *)&pxVar13->field_2;
          if (bVar5) goto LAB_002b40ab;
        }
      }
    }
    else {
      this_00 = pxVar14;
      if (cVar1 == '\x01') {
        this_00 = pxVar15;
        cVar1 = cVar2;
        pxVar15 = pxVar14;
      }
      if (cVar1 == '\x02') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        local_88 = eval_number(this_00,c,stack);
        eval_node_set(&local_a8,pxVar15,c,stack,nodeset_eval_all);
        do {
          uVar6 = local_a8._begin != local_a8._end;
          if (local_a8._begin == local_a8._end) break;
          local_c8._0_8_ = stack->result;
          local_c8._eos = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_error;
          local_c8._begin = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root;
          local_c8._end = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root_size;
          string_value((xpath_string *)&local_80,local_a8._begin,(xpath_allocator *)local_c8._0_8_);
          local_d0 = convert_string_to_number((char_t *)local_80._target);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_c8);
          local_a8._begin = local_a8._begin + 1;
        } while ((local_88 != local_d0) || (NAN(local_88) || NAN(local_d0)));
      }
      else {
        if (cVar1 != '\x03') {
          if (cVar1 != '\x04') goto LAB_002b49a4;
          bVar7 = eval_boolean(this_00,c,stack);
          goto LAB_002b4257;
        }
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_80,this_00,c,stack);
        eval_node_set(&local_a8,pxVar15,c,stack,nodeset_eval_all);
        do {
          uVar6 = local_a8._begin != local_a8._end;
          if (local_a8._begin == local_a8._end) break;
          local_c8._0_8_ = stack->result;
          local_c8._eos = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_error;
          local_c8._begin = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root;
          local_c8._end = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root_size;
          string_value(&local_60,local_a8._begin,(xpath_allocator *)local_c8._0_8_);
          bVar5 = strequal((char_t *)local_80._target,local_60._buffer);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_c8);
          local_a8._begin = local_a8._begin + 1;
        } while (!bVar5);
      }
    }
    goto LAB_002b40ab;
  }
  if (cVar2 == '\x04' || cVar1 == '\x04') {
    bVar7 = eval_boolean(pxVar14,c,stack);
LAB_002b4257:
    bVar5 = eval_boolean(pxVar15,c,stack);
    bVar5 = (bool)(bVar5 ^ bVar7);
LAB_002b4265:
    local_fc = bVar5 ^ local_fc ^ xpath_type_node_set;
    goto LAB_002b42f4;
  }
  if (cVar1 != '\x02' && cVar2 != '\x02') {
    if (cVar1 != '\x03' && cVar2 != '\x03') {
LAB_002b49a4:
      pcVar12 = 
      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::equal_to]"
      ;
LAB_002b49b9:
      __assert_fail("false && \"Wrong types\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x265a,pcVar12);
    }
    v = (double)stack->result;
    local_e8 = ((xpath_allocator *)v)->_root;
    sStack_e0 = ((xpath_allocator *)v)->_root_size;
    local_d8 = ((xpath_allocator *)v)->_error;
    eval_string((xpath_string *)&local_a8,pxVar14,c,stack);
    eval_string((xpath_string *)&local_c8,pxVar15,c,stack);
    uVar6 = strequal((char_t *)local_a8._0_8_,(char_t *)local_c8._0_8_);
    goto LAB_002b40ab;
  }
  local_d0 = eval_number(pxVar14,c,stack);
  dVar4 = eval_number(pxVar15,c,stack);
  uVar6 = dVar4 == local_d0;
  goto LAB_002b42f1;
  while( true ) {
    local_c8._0_8_ = stack->result;
    local_c8._eos = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_error;
    local_c8._begin = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root;
    local_c8._end = (xpath_node *)((xpath_allocator *)local_c8._0_8_)->_root_size;
    string_value(&local_60,local_a8._begin,(xpath_allocator *)local_c8._0_8_);
    bVar5 = strequal((char_t *)local_80._target,local_60._buffer);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_c8);
    local_a8._begin = local_a8._begin + 1;
    if (!bVar5) break;
LAB_002b482a:
    uVar6 = local_a8._begin != local_a8._end;
    if (local_a8._begin == local_a8._end) break;
  }
LAB_002b40ab:
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&v);
LAB_002b42f1:
  local_fc = local_fc ^ uVar6;
LAB_002b42f4:
  return (bool)(local_fc & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}